

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMesh.cpp
# Opt level: O1

void __thiscall
cbtTriangleMesh::cbtTriangleMesh
          (cbtTriangleMesh *this,bool use32bitIndices,bool use4componentVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uchar **ppuVar4;
  bool bVar5;
  cbtIndexedMesh *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  cbtAlignedObjectArray<unsigned_int> *pcVar14;
  cbtStridingMeshInterface *pcVar15;
  int iVar16;
  cbtIndexedMesh *pcVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.m_scaling.m_floats[0] =
       1.0;
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.m_scaling.m_floats[1] =
       1.0;
  pcVar15 = &(this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface;
  (pcVar15->m_scaling).m_floats[2] = 1.0;
  (pcVar15->m_scaling).m_floats[3] = 0.0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data = (cbtIndexedMesh *)0x0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size = 0;
  (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_capacity = 0;
  (this->super_cbtTriangleIndexVertexArray).m_hasAabb = 0;
  (this->super_cbtTriangleIndexVertexArray).super_cbtStridingMeshInterface.
  _vptr_cbtStridingMeshInterface = (_func_int **)&PTR__cbtTriangleMesh_00b71738;
  (this->m_4componentVertices).m_ownsMemory = true;
  (this->m_4componentVertices).m_data = (cbtVector3 *)0x0;
  (this->m_4componentVertices).m_size = 0;
  (this->m_4componentVertices).m_capacity = 0;
  (this->m_3componentVertices).m_ownsMemory = true;
  (this->m_3componentVertices).m_data = (float *)0x0;
  (this->m_3componentVertices).m_size = 0;
  (this->m_3componentVertices).m_capacity = 0;
  (this->m_32bitIndices).m_ownsMemory = true;
  (this->m_32bitIndices).m_data = (uint *)0x0;
  (this->m_32bitIndices).m_size = 0;
  (this->m_32bitIndices).m_capacity = 0;
  (this->m_16bitIndices).m_ownsMemory = true;
  (this->m_16bitIndices).m_data = (unsigned_short *)0x0;
  (this->m_16bitIndices).m_size = 0;
  (this->m_16bitIndices).m_capacity = 0;
  this->m_use32bitIndices = use32bitIndices;
  this->m_use4componentVertices = use4componentVertices;
  this->m_weldingThreshold = 0.0;
  iVar19 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  iVar16 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_capacity;
  if (iVar19 == iVar16) {
    iVar21 = 1;
    if (iVar19 != 0) {
      iVar21 = iVar19 * 2;
    }
    if (iVar16 < iVar21) {
      if (iVar21 == 0) {
        pcVar17 = (cbtIndexedMesh *)0x0;
      }
      else {
        pcVar17 = (cbtIndexedMesh *)cbtAlignedAllocInternal((long)iVar21 * 0x30,0x10);
      }
      lVar18 = (long)(this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
      if (0 < lVar18) {
        lVar20 = 0;
        do {
          pcVar6 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
          puVar2 = (undefined8 *)((long)&pcVar6->m_numTriangles + lVar20);
          uVar7 = *puVar2;
          uVar8 = puVar2[1];
          uVar9 = puVar2[2];
          uVar10 = puVar2[3];
          puVar2 = (undefined8 *)((long)&pcVar6->m_triangleIndexStride + lVar20);
          uVar11 = puVar2[1];
          uVar12 = puVar2[2];
          uVar13 = puVar2[3];
          puVar3 = (undefined8 *)((long)&pcVar17->m_triangleIndexStride + lVar20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar11;
          puVar3[2] = uVar12;
          puVar3[3] = uVar13;
          puVar2 = (undefined8 *)((long)&pcVar17->m_numTriangles + lVar20);
          *puVar2 = uVar7;
          puVar2[1] = uVar8;
          puVar2[2] = uVar9;
          puVar2[3] = uVar10;
          lVar20 = lVar20 + 0x30;
        } while (lVar18 * 0x30 != lVar20);
      }
      pcVar6 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
      if (pcVar6 != (cbtIndexedMesh *)0x0) {
        if ((this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar6);
        }
        (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data = (cbtIndexedMesh *)0x0;
      }
      (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
      (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data = pcVar17;
      (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_capacity = iVar21;
    }
  }
  pcVar17 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar19 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  pcVar17[iVar19].m_numTriangles = 0;
  ppuVar4 = &pcVar17[iVar19].m_triangleIndexBase;
  *ppuVar4 = (uchar *)0x0;
  ppuVar4[1] = (uchar *)0xc;
  ppuVar4[2] = (uchar *)0x0;
  ppuVar4[3] = (uchar *)0x200000010;
  pcVar17[iVar19].m_vertexType = PHY_FLOAT;
  piVar1 = &(this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_size;
  *piVar1 = *piVar1 + 1;
  bVar5 = this->m_use32bitIndices;
  pcVar17 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar16 = 0xc;
  iVar19 = 6;
  pcVar14 = (cbtAlignedObjectArray<unsigned_int> *)&this->m_16bitIndices;
  if (bVar5 != PHY_FLOAT) {
    iVar19 = 0xc;
    pcVar14 = &this->m_32bitIndices;
  }
  pcVar17->m_numTriangles = pcVar14->m_size / 3;
  pcVar17->m_triangleIndexBase = (uchar *)0x0;
  pcVar17->m_indexType = bVar5 ^ PHY_SHORT;
  pcVar17->m_triangleIndexStride = iVar19;
  if (this->m_use4componentVertices == false) {
    iVar19 = (this->m_3componentVertices).m_size / 3;
  }
  else {
    iVar19 = (this->m_4componentVertices).m_size;
    iVar16 = 0x10;
  }
  pcVar17 = (this->super_cbtTriangleIndexVertexArray).m_indexedMeshes.m_data;
  pcVar17->m_numVertices = iVar19;
  pcVar17->m_vertexBase = (uchar *)0x0;
  pcVar17->m_vertexStride = iVar16;
  return;
}

Assistant:

cbtTriangleMesh::cbtTriangleMesh(bool use32bitIndices, bool use4componentVertices)
	: m_use32bitIndices(use32bitIndices),
	  m_use4componentVertices(use4componentVertices),
	  m_weldingThreshold(0.0)
{
	cbtIndexedMesh meshIndex;
	meshIndex.m_numTriangles = 0;
	meshIndex.m_numVertices = 0;
	meshIndex.m_indexType = PHY_INTEGER;
	meshIndex.m_triangleIndexBase = 0;
	meshIndex.m_triangleIndexStride = 3 * sizeof(int);
	meshIndex.m_vertexBase = 0;
	meshIndex.m_vertexStride = sizeof(cbtVector3);
	m_indexedMeshes.push_back(meshIndex);

	if (m_use32bitIndices)
	{
		m_indexedMeshes[0].m_numTriangles = m_32bitIndices.size() / 3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_INTEGER;
		m_indexedMeshes[0].m_triangleIndexStride = 3 * sizeof(int);
	}
	else
	{
		m_indexedMeshes[0].m_numTriangles = m_16bitIndices.size() / 3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_SHORT;
		m_indexedMeshes[0].m_triangleIndexStride = 3 * sizeof(short int);
	}

	if (m_use4componentVertices)
	{
		m_indexedMeshes[0].m_numVertices = m_4componentVertices.size();
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = sizeof(cbtVector3);
	}
	else
	{
		m_indexedMeshes[0].m_numVertices = m_3componentVertices.size() / 3;
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = 3 * sizeof(cbtScalar);
	}
}